

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O0

void CheckId(TidyDocImpl *doc,Node *node,AttVal *attval)

{
  Lexer *pLVar1;
  Bool BVar2;
  Node *pNVar3;
  Node *old;
  Lexer *lexer;
  AttVal *attval_local;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  pLVar1 = doc->lexer;
  if ((attval == (AttVal *)0x0) || (attval->value == (tmbstr)0x0)) {
    prvTidyReportAttrError(doc,node,attval,0x256);
  }
  else {
    BVar2 = prvTidyIsValidHTMLID(attval->value);
    if (BVar2 == no) {
      if ((pLVar1->isvoyager == no) || (BVar2 = prvTidyIsValidXMLID(attval->value), BVar2 == no)) {
        prvTidyReportAttrError(doc,node,attval,0x22b);
      }
      else {
        prvTidyReportAttrError(doc,node,attval,0x292);
      }
    }
    pNVar3 = GetNodeByAnchor(doc,attval->value);
    if ((pNVar3 == (Node *)0x0) || (pNVar3 == node)) {
      AddAnchor(doc,attval->value,node);
    }
    else if (node->implicit == no) {
      prvTidyReportAttrError(doc,node,attval,0x223);
    }
    else {
      prvTidyReportAttrError(doc,node,attval,0x224);
    }
  }
  return;
}

Assistant:

void CheckId( TidyDocImpl* doc, Node *node, AttVal *attval )
{
    Lexer* lexer = doc->lexer;
    Node *old;

    if (!AttrHasValue(attval))
    {
        TY_(ReportAttrError)( doc, node, attval, MISSING_ATTR_VALUE);
        return;
    }

    if (!TY_(IsValidHTMLID)(attval->value))
    {
        if (lexer->isvoyager && TY_(IsValidXMLID)(attval->value))
            TY_(ReportAttrError)( doc, node, attval, XML_ID_SYNTAX);
        else
            TY_(ReportAttrError)( doc, node, attval, BAD_ATTRIBUTE_VALUE);
    }

    if ((old = GetNodeByAnchor(doc, attval->value)) &&  old != node)
    {
        if (node->implicit) /* Is #709 - improve warning text */
            TY_(ReportAttrError)(doc, node, attval, ANCHOR_DUPLICATED);
        else
            TY_(ReportAttrError)( doc, node, attval, ANCHOR_NOT_UNIQUE);
    }
    else
        AddAnchor( doc, attval->value, node );
}